

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

wchar_t set_xattrs(archive_write_disk *a)

{
  archive_entry *entry;
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  bool bVar6;
  wchar_t local_70;
  char *name;
  size_t size;
  void *value;
  archive_string local_48;
  
  entry = a->entry;
  wVar2 = archive_entry_xattr_reset(entry);
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  local_70 = L'\0';
  bVar1 = false;
LAB_00146605:
  do {
    bVar6 = wVar2 == L'\0';
    wVar2 = wVar2 + L'\xffffffff';
    if (bVar6) {
      if (local_70 == L'\xffffffec') {
        if (local_48.length == 0 || !bVar1) {
          archive_set_error(&a->archive,-1,"Cannot restore extended attributes on this file system."
                           );
        }
        else {
          local_48.s[local_48.length - 1] = '\0';
          local_48.length = local_48.length - 1;
          archive_set_error(&a->archive,-1,"Cannot restore extended attributes: %s",local_48.s);
        }
      }
      archive_string_free(&local_48);
      return local_70;
    }
    archive_entry_xattr_next(entry,&name,&value,&size);
    pcVar4 = name;
  } while (name == (char *)0x0);
  iVar3 = strncmp(name,"system.",7);
  if (iVar3 == 0) goto LAB_0014669f;
  goto LAB_00146642;
LAB_0014669f:
  iVar3 = strcmp(pcVar4 + 7,"posix_acl_access");
  if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4 + 7,"posix_acl_default"), iVar3 != 0)) {
LAB_00146642:
    iVar3 = strncmp(pcVar4,"trusted.SGI_",0xc);
    if (iVar3 == 0) {
      iVar3 = strcmp(pcVar4 + 0xc,"ACL_DEFAULT");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar4 + 0xc,"ACL_FILE"), iVar3 == 0)) goto LAB_00146605;
    }
    iVar3 = strncmp(pcVar4,"xfsroot.",8);
    if (iVar3 == 0) {
      archive_strcat(&local_48,pcVar4);
      archive_strappend_char(&local_48,' ');
      bVar1 = true;
    }
    else {
      if (a->fd < L'\0') {
        pcVar4 = archive_entry_pathname(entry);
        iVar3 = lsetxattr(pcVar4,name,value,size,0);
      }
      else {
        iVar3 = fsetxattr(a->fd,pcVar4,value,size,0);
      }
      if (iVar3 == -1) {
        archive_strcat(&local_48,name);
        archive_strappend_char(&local_48,' ');
        piVar5 = __errno_location();
        if (*piVar5 != 0x26) {
          local_70 = L'\xffffffec';
          if (*piVar5 == 0x5f) goto LAB_00146605;
          bVar1 = true;
        }
        local_70 = L'\xffffffec';
      }
    }
  }
  goto LAB_00146605;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	struct archive_entry *entry = a->entry;
	struct archive_string errlist;
	int ret = ARCHIVE_OK;
	int i = archive_entry_xattr_reset(entry);
	short fail = 0;

	archive_string_init(&errlist);

	while (i--) {
		const char *name;
		const void *value;
		size_t size;
		int e;

		archive_entry_xattr_next(entry, &name, &value, &size);

		if (name == NULL)
			continue;
#if ARCHIVE_XATTR_LINUX
		/* Linux: quietly skip POSIX.1e ACL extended attributes */
		if (strncmp(name, "system.", 7) == 0 &&
		   (strcmp(name + 7, "posix_acl_access") == 0 ||
		    strcmp(name + 7, "posix_acl_default") == 0))
			continue;
		if (strncmp(name, "trusted.SGI_", 12) == 0 &&
		   (strcmp(name + 12, "ACL_DEFAULT") == 0 ||
		    strcmp(name + 12, "ACL_FILE") == 0))
			continue;

		/* Linux: xfsroot namespace is obsolete and unsupported */
		if (strncmp(name, "xfsroot.", 8) == 0) {
			fail = 1;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			continue;
		}
#endif

		if (a->fd >= 0) {
#if ARCHIVE_XATTR_LINUX
			e = fsetxattr(a->fd, name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = fsetxattr(a->fd, name, value, size, 0, 0);
#elif ARCHIVE_XATTR_AIX
			e = fsetea(a->fd, name, value, size, 0);
#endif
		} else {
#if ARCHIVE_XATTR_LINUX
			e = lsetxattr(archive_entry_pathname(entry),
			    name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = setxattr(archive_entry_pathname(entry),
			    name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
			e = lsetea(archive_entry_pathname(entry),
			    name, value, size, 0);
#endif
		}
		if (e == -1) {
			ret = ARCHIVE_WARN;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			if (errno != ENOTSUP && errno != ENOSYS)
				fail = 1;
		}
	}

	if (ret == ARCHIVE_WARN) {
		if (fail && errlist.length > 0) {
			errlist.length--;
			errlist.s[errlist.length] = '\0';
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended attributes: %s",
			    errlist.s);
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended "
			    "attributes on this file system.");
	}

	archive_string_free(&errlist);
	return (ret);
}